

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim.cpp
# Opt level: O3

void __thiscall nvim::Nvim::async_get_option(Nvim *this,string *name)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"nvim_get_option","");
  NvimRPC::async_call<std::__cxx11::string>(&this->client_,&local_40,name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Nvim::async_get_option(const std::string& name) {
    client_.async_call("nvim_get_option", name);
}